

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expreplay.h
# Opt level: O2

base_learner *
ExpReplay::expreplay_setup<(char)99,COST_SENSITIVE::cs_label>(options_i *options,vw *all)

{
  undefined8 *puVar1;
  int iVar2;
  option_group_definition *this;
  typed_option<unsigned_long> *ptVar3;
  example *peVar4;
  long lVar5;
  bool *pbVar6;
  ostream *poVar7;
  base_learner *l;
  single_learner *base;
  learner<ExpReplay::expreplay,_example> *plVar8;
  size_t n;
  ulong uVar9;
  allocator local_3ca;
  allocator local_3c9;
  free_ptr<ExpReplay::expreplay> er;
  string replay_string;
  string replay_count_string;
  string local_378 [32];
  string local_358;
  string local_338 [32];
  string local_318;
  string local_2f8;
  option_group_definition new_options;
  undefined1 local_2a0 [112];
  bool local_230;
  typed_option<unsigned_long> local_200;
  typed_option<unsigned_long> local_160;
  typed_option<unsigned_long> local_c0;
  
  std::__cxx11::string::string((string *)&replay_string,"replay_",(allocator *)local_2a0);
  std::__cxx11::string::push_back((char)&replay_string);
  std::__cxx11::string::string((string *)&replay_count_string,(string *)&replay_string);
  std::__cxx11::string::append((char *)&replay_count_string);
  scoped_calloc_or_throw<ExpReplay::expreplay>();
  std::__cxx11::string::string((string *)&local_2f8,"Experience Replay",(allocator *)local_2a0);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::string((string *)&local_318,(string *)&replay_string);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_2a0,&local_318,
             &(er._M_t.super___uniq_ptr_impl<ExpReplay::expreplay,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_ExpReplay::expreplay_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_ExpReplay::expreplay_*,_false>._M_head_impl)->N);
  local_230 = true;
  std::__cxx11::string::string
            (local_338,
             "use experience replay at a specified level [b=classification/regression, m=multiclass, c=cost sensitive] with specified buffer size"
             ,&local_3c9);
  std::__cxx11::string::_M_assign((string *)(local_2a0 + 0x30));
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_c0,(typed_option<unsigned_long> *)local_2a0);
  this = VW::config::option_group_definition::add<unsigned_long>(&new_options,&local_c0);
  std::__cxx11::string::string((string *)&local_358,(string *)&replay_count_string);
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_200,&local_358,
             &(er._M_t.super___uniq_ptr_impl<ExpReplay::expreplay,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_ExpReplay::expreplay_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_ExpReplay::expreplay_*,_false>._M_head_impl)->replay_count);
  ptVar3 = VW::config::typed_option<unsigned_long>::default_value(&local_200,1);
  std::__cxx11::string::string
            (local_378,
             "how many times (in expectation) should each example be played (default: 1 = permuting)"
             ,&local_3ca);
  std::__cxx11::string::_M_assign((string *)&(ptVar3->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_160,ptVar3);
  VW::config::option_group_definition::add<unsigned_long>(this,&local_160);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_160);
  std::__cxx11::string::~string(local_378);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_200);
  std::__cxx11::string::~string((string *)&local_358);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_c0);
  std::__cxx11::string::~string(local_338);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_2a0);
  std::__cxx11::string::~string((string *)&local_318);
  (**options->_vptr_options_i)(options,&new_options);
  iVar2 = (*options->_vptr_options_i[1])(options,&replay_string);
  if (((char)iVar2 == '\0') ||
     ((er._M_t.super___uniq_ptr_impl<ExpReplay::expreplay,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_ExpReplay::expreplay_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_ExpReplay::expreplay_*,_false>._M_head_impl)->N == 0)) {
    plVar8 = (learner<ExpReplay::expreplay,_example> *)0x0;
  }
  else {
    (er._M_t.super___uniq_ptr_impl<ExpReplay::expreplay,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_ExpReplay::expreplay_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_ExpReplay::expreplay_*,_false>._M_head_impl)->all = all;
    peVar4 = VW::alloc_examples(1,(er._M_t.
                                   super___uniq_ptr_impl<ExpReplay::expreplay,_void_(*)(void_*)>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_ExpReplay::expreplay_*,_void_(*)(void_*)>.
                                   super__Head_base<0UL,_ExpReplay::expreplay_*,_false>._M_head_impl
                                  )->N);
    (er._M_t.super___uniq_ptr_impl<ExpReplay::expreplay,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_ExpReplay::expreplay_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_ExpReplay::expreplay_*,_false>._M_head_impl)->buf = peVar4;
    lVar5 = 0x6828;
    for (uVar9 = 0;
        uVar9 < (er._M_t.super___uniq_ptr_impl<ExpReplay::expreplay,_void_(*)(void_*)>._M_t.
                 super__Tuple_impl<0UL,_ExpReplay::expreplay_*,_void_(*)(void_*)>.
                 super__Head_base<0UL,_ExpReplay::expreplay_*,_false>._M_head_impl)->N;
        uVar9 = uVar9 + 1) {
      peVar4 = (er._M_t.super___uniq_ptr_impl<ExpReplay::expreplay,_void_(*)(void_*)>._M_t.
                super__Tuple_impl<0UL,_ExpReplay::expreplay_*,_void_(*)(void_*)>.
                super__Head_base<0UL,_ExpReplay::expreplay_*,_false>._M_head_impl)->buf;
      puVar1 = (undefined8 *)((long)(peVar4->super_example_predict).feature_space + lVar5 + -0x10);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)(peVar4->super_example_predict).feature_space + lVar5 + -0x20);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar5 = lVar5 + 0x68d0;
    }
    pbVar6 = calloc_or_throw<bool>
                       ((er._M_t.super___uniq_ptr_impl<ExpReplay::expreplay,_void_(*)(void_*)>._M_t.
                         super__Tuple_impl<0UL,_ExpReplay::expreplay_*,_void_(*)(void_*)>.
                         super__Head_base<0UL,_ExpReplay::expreplay_*,_false>._M_head_impl)->N);
    (er._M_t.super___uniq_ptr_impl<ExpReplay::expreplay,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_ExpReplay::expreplay_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_ExpReplay::expreplay_*,_false>._M_head_impl)->filled = pbVar6;
    if (all->quiet == false) {
      poVar7 = std::operator<<((ostream *)&std::cerr,"experience replay level=");
      poVar7 = std::operator<<(poVar7,'c');
      poVar7 = std::operator<<(poVar7,", buffer=");
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      poVar7 = std::operator<<(poVar7,", replay count=");
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    (er._M_t.super___uniq_ptr_impl<ExpReplay::expreplay,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_ExpReplay::expreplay_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_ExpReplay::expreplay_*,_false>._M_head_impl)->base = base;
    plVar8 = LEARNER::init_learner<ExpReplay::expreplay,example,LEARNER::learner<char,example>>
                       (&er,base,predict_or_learn<true,COST_SENSITIVE::cs_label>,
                        predict_or_learn<false,COST_SENSITIVE::cs_label>);
    *(undefined8 *)(plVar8 + 0xb8) = *(undefined8 *)(plVar8 + 0x18);
    *(undefined8 *)(plVar8 + 0xc0) = *(undefined8 *)(plVar8 + 0x20);
    *(code **)(plVar8 + 200) = finish<COST_SENSITIVE::cs_label>;
    *(undefined8 *)(plVar8 + 0x88) = *(undefined8 *)(plVar8 + 0x18);
    *(undefined8 *)(plVar8 + 0x90) = *(undefined8 *)(plVar8 + 0x20);
    *(code **)(plVar8 + 0x98) = end_pass;
  }
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::~unique_ptr(&er);
  std::__cxx11::string::~string((string *)&replay_count_string);
  std::__cxx11::string::~string((string *)&replay_string);
  return (base_learner *)plVar8;
}

Assistant:

LEARNER::base_learner* expreplay_setup(VW::config::options_i& options, vw& all)
{
  std::string replay_string = "replay_";
  replay_string += er_level;
  std::string replay_count_string = replay_string;
  replay_count_string += "_count";

  auto er = scoped_calloc_or_throw<expreplay>();
  VW::config::option_group_definition new_options("Experience Replay");
  new_options
      .add(VW::config::make_option(replay_string, er->N)
               .keep()
               .help("use experience replay at a specified level [b=classification/regression, m=multiclass, c=cost "
                     "sensitive] with specified buffer size"))
      .add(VW::config::make_option(replay_count_string, er->replay_count)
               .default_value(1)
               .help("how many times (in expectation) should each example be played (default: 1 = permuting)"));
  options.add_and_parse(new_options);

  if (!options.was_supplied(replay_string) || er->N == 0)
    return nullptr;

  er->all = &all;
  er->buf = VW::alloc_examples(1, er->N);

  if (er_level == 'c')
    for (size_t n = 0; n < er->N; n++) er->buf[n].l.cs.costs = v_init<COST_SENSITIVE::wclass>();

  er->filled = calloc_or_throw<bool>(er->N);

  if (!all.quiet)
    std::cerr << "experience replay level=" << er_level << ", buffer=" << er->N << ", replay count=" << er->replay_count
              << std::endl;

  er->base = LEARNER::as_singleline(setup_base(options, all));
  LEARNER::learner<expreplay, example>* l =
      &init_learner(er, er->base, predict_or_learn<true, lp>, predict_or_learn<false, lp>);
  l->set_finish(finish<lp>);
  l->set_end_pass(end_pass);

  return make_base(*l);
}